

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.h
# Opt level: O0

result_type * __thiscall
jbcoin::sha512Half<unsigned_short,jbcoin::base_uint<256ul,void>,unsigned_long>
          (result_type *__return_storage_ptr__,jbcoin *this,unsigned_short *args,
          base_uint<256UL,_void> *args_1,unsigned_long *args_2)

{
  undefined1 local_f8 [8];
  sha512_half_hasher h;
  unsigned_long *args_local_2;
  base_uint<256UL,_void> *args_local_1;
  unsigned_short *args_local;
  
  h.h_.ctx_._208_8_ = args_1;
  detail::basic_sha512_half_hasher<false>::basic_sha512_half_hasher
            ((basic_sha512_half_hasher<false> *)local_f8);
  beast::
  hash_append<jbcoin::detail::basic_sha512_half_hasher<false>,unsigned_short,jbcoin::base_uint<256ul,void>,unsigned_long>
            ((basic_sha512_half_hasher<false> *)local_f8,(unsigned_short *)this,
             (base_uint<256UL,_void> *)args,(unsigned_long *)h.h_.ctx_._208_8_);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (__return_storage_ptr__,(basic_sha512_half_hasher *)local_f8);
  detail::basic_sha512_half_hasher<false>::~basic_sha512_half_hasher
            ((basic_sha512_half_hasher<false> *)local_f8);
  return __return_storage_ptr__;
}

Assistant:

sha512_half_hasher::result_type
sha512Half (Args const&... args)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, args...);
    return static_cast<typename
        sha512_half_hasher::result_type>(h);
}